

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

string * __thiscall
sqlite_orm::internal::
table_t<relive::Station,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>>
::find_column_name<long,relive::Station,void>
          (table_t<relive::Station,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,type m)

{
  table_t<relive::Station,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *in_RDI;
  string *res;
  table_t<relive::Station,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  for_each_column_with_field_type<long,sqlite_orm::internal::table_t<relive::Station,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>>::find_column_name<long,relive::Station,void>(long_relive::Station::*)const::_lambda(auto:1&)_1_>
            (this_00,(anon_class_16_2_de34c1f6 *)in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }